

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall kj::Arena::setDestructor(Arena *this,void *ptr,_func_void_void_ptr *destructor)

{
  *(_func_void_void_ptr **)((long)ptr + -0x10) = destructor;
  *(ObjectHeader **)((long)ptr + -8) = this->objectList;
  this->objectList = (ObjectHeader *)((long)ptr + -0x10);
  return;
}

Assistant:

void Arena::setDestructor(void* ptr, void (*destructor)(void*)) {
  ObjectHeader* header = reinterpret_cast<ObjectHeader*>(ptr) - 1;
  KJ_DASSERT(reinterpret_cast<uintptr_t>(header) % alignof(ObjectHeader) == 0);
  header->destructor = destructor;
  header->next = objectList;
  objectList = header;
}